

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::VerifyUtf8String
               (char *data,int size,Operation op,char *field_name)

{
  bool bVar1;
  char *operation_str;
  bool in_stack_000000d7;
  char *in_stack_000000d8;
  char *in_stack_000000e0;
  char *in_stack_ffffffffffffffc8;
  
  bVar1 = IsStructurallyValidUTF8(in_stack_ffffffffffffffc8,0);
  if (!bVar1) {
    PrintUTF8ErrorLog(in_stack_000000e0,in_stack_000000d8,in_stack_000000d7);
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data, int size, Operation op,
                                      const char* field_name) {
  if (!IsStructurallyValidUTF8(data, size)) {
    const char* operation_str = NULL;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
        // no default case: have the compiler warn if a case is not covered.
    }
    PrintUTF8ErrorLog(field_name, operation_str, false);
    return false;
  }
  return true;
}